

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall
duckdb::ART::GenerateKeys<false>
          (ART *this,ArenaAllocator *allocator,DataChunk *input,unsafe_vector<ARTKey> *keys)

{
  byte bVar1;
  long lVar2;
  idx_t i;
  ulong uVar3;
  
  GenerateKeysInternal<false>(allocator,input,keys);
  if (this->verify_max_key_len == true) {
    bVar1 = this->prefix_count;
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < input->count; uVar3 = uVar3 + 1) {
      ARTKey::VerifyKeyLength
                ((ARTKey *)
                 ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar2),
                 (ulong)bVar1 << 0xd);
      lVar2 = lVar2 + 0x10;
    }
  }
  return;
}

Assistant:

void ART::GenerateKeys<>(ArenaAllocator &allocator, DataChunk &input, unsafe_vector<ARTKey> &keys) {
	GenerateKeysInternal<false>(allocator, input, keys);
	if (!verify_max_key_len) {
		return;
	}
	auto max_len = MAX_KEY_LEN * idx_t(prefix_count);
	for (idx_t i = 0; i < input.size(); i++) {
		keys[i].VerifyKeyLength(max_len);
	}
}